

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseAST.cpp
# Opt level: O0

void __thiscall
antlr::BaseAST::doWorkForFindAll
          (BaseAST *this,
          vector<antlr::ASTRefCount<antlr::AST>,_std::allocator<antlr::ASTRefCount<antlr::AST>_>_>
          *v,RefAST *target,bool partialMatch)

{
  byte bVar1;
  uint uVar2;
  int iVar3;
  AST *pAVar4;
  AST *pAVar5;
  byte in_CL;
  vector<antlr::ASTRefCount<antlr::AST>,_std::allocator<antlr::ASTRefCount<antlr::AST>_>_> *in_RDX;
  BaseAST *in_RSI;
  RefAST sibling;
  BaseAST *in_stack_ffffffffffffff28;
  AST *in_stack_ffffffffffffff30;
  AST *in_stack_ffffffffffffff38;
  byte local_9b;
  byte local_9a;
  undefined1 local_80 [16];
  ASTRefCount local_70 [8];
  ASTRefCount<antlr::BaseAST> local_68;
  ASTRefCount local_60 [15];
  byte local_51;
  undefined1 local_50 [15];
  byte local_41;
  undefined1 local_40 [24];
  ASTRefCount local_28 [7];
  undefined1 in_stack_ffffffffffffffdf;
  undefined7 in_stack_ffffffffffffffe0;
  
  bVar1 = in_CL & 1;
  ASTRefCount<antlr::AST>::ASTRefCount
            ((ASTRefCount<antlr::AST> *)in_stack_ffffffffffffff30,
             &in_stack_ffffffffffffff28->super_AST);
  do {
    pAVar4 = ASTRefCount::operator_cast_to_AST_(local_28);
    if (pAVar4 == (AST *)0x0) {
      ASTRefCount<antlr::AST>::~ASTRefCount((ASTRefCount<antlr::AST> *)in_stack_ffffffffffffff30);
      return;
    }
    local_41 = 0;
    local_51 = 0;
    if ((bVar1 & 1) == 0) {
LAB_00222866:
      local_9b = 0;
      if ((bVar1 & 1) == 0) {
        pAVar4 = ASTRefCount<antlr::AST>::operator->((ASTRefCount<antlr::AST> *)local_28);
        ASTRefCount<antlr::AST>::ASTRefCount
                  ((ASTRefCount<antlr::AST> *)in_stack_ffffffffffffff30,
                   (ASTRefCount<antlr::AST> *)in_stack_ffffffffffffff28);
        local_51 = 1;
        iVar3 = (*pAVar4->_vptr_AST[7])(pAVar4,local_50);
        local_9b = (byte)iVar3;
      }
      local_9a = local_9b;
    }
    else {
      pAVar4 = ASTRefCount<antlr::AST>::operator->((ASTRefCount<antlr::AST> *)local_28);
      ASTRefCount<antlr::AST>::ASTRefCount
                ((ASTRefCount<antlr::AST> *)in_stack_ffffffffffffff30,
                 (ASTRefCount<antlr::AST> *)in_stack_ffffffffffffff28);
      local_41 = 1;
      uVar2 = (*pAVar4->_vptr_AST[8])(pAVar4,local_40);
      local_9a = 1;
      if ((uVar2 & 1) == 0) goto LAB_00222866;
    }
    if ((local_51 & 1) != 0) {
      ASTRefCount<antlr::AST>::~ASTRefCount((ASTRefCount<antlr::AST> *)in_stack_ffffffffffffff30);
    }
    if ((local_41 & 1) != 0) {
      ASTRefCount<antlr::AST>::~ASTRefCount((ASTRefCount<antlr::AST> *)in_stack_ffffffffffffff30);
    }
    if ((local_9a & 1) != 0) {
      std::vector<antlr::ASTRefCount<antlr::AST>,_std::allocator<antlr::ASTRefCount<antlr::AST>_>_>
      ::push_back((vector<antlr::ASTRefCount<antlr::AST>,_std::allocator<antlr::ASTRefCount<antlr::AST>_>_>
                   *)in_stack_ffffffffffffff30,(value_type *)in_stack_ffffffffffffff28);
    }
    pAVar4 = ASTRefCount<antlr::AST>::operator->((ASTRefCount<antlr::AST> *)local_28);
    (*pAVar4->_vptr_AST[0xd])(local_60);
    pAVar4 = ASTRefCount::operator_cast_to_AST_(local_60);
    ASTRefCount<antlr::AST>::~ASTRefCount((ASTRefCount<antlr::AST> *)in_stack_ffffffffffffff30);
    if (pAVar4 != (AST *)0x0) {
      in_stack_ffffffffffffff38 =
           ASTRefCount<antlr::AST>::operator->((ASTRefCount<antlr::AST> *)local_28);
      (*in_stack_ffffffffffffff38->_vptr_AST[0xd])(local_70);
      in_stack_ffffffffffffff30 = ASTRefCount::operator_cast_to_AST_(local_70);
      ASTRefCount<antlr::BaseAST>::ASTRefCount
                ((ASTRefCount<antlr::BaseAST> *)in_stack_ffffffffffffff30,
                 &in_stack_ffffffffffffff28->super_AST);
      in_stack_ffffffffffffff28 = ASTRefCount<antlr::BaseAST>::operator->(&local_68);
      ASTRefCount<antlr::AST>::ASTRefCount
                ((ASTRefCount<antlr::AST> *)in_stack_ffffffffffffff30,
                 (ASTRefCount<antlr::AST> *)in_stack_ffffffffffffff28);
      doWorkForFindAll(in_RSI,in_RDX,(RefAST *)CONCAT17(bVar1,in_stack_ffffffffffffffe0),
                       (bool)in_stack_ffffffffffffffdf);
      ASTRefCount<antlr::AST>::~ASTRefCount((ASTRefCount<antlr::AST> *)in_stack_ffffffffffffff30);
      ASTRefCount<antlr::BaseAST>::~ASTRefCount
                ((ASTRefCount<antlr::BaseAST> *)in_stack_ffffffffffffff30);
      ASTRefCount<antlr::AST>::~ASTRefCount((ASTRefCount<antlr::AST> *)in_stack_ffffffffffffff30);
    }
    pAVar5 = ASTRefCount<antlr::AST>::operator->((ASTRefCount<antlr::AST> *)local_28);
    (*pAVar5->_vptr_AST[0xe])(local_80);
    ASTRefCount<antlr::AST>::operator=
              ((ASTRefCount<antlr::AST> *)pAVar4,
               (ASTRefCount<antlr::AST> *)in_stack_ffffffffffffff38);
    ASTRefCount<antlr::AST>::~ASTRefCount((ASTRefCount<antlr::AST> *)in_stack_ffffffffffffff30);
  } while( true );
}

Assistant:

void BaseAST::doWorkForFindAll(
		ANTLR_USE_NAMESPACE(std)vector<RefAST>& v,
		RefAST target,bool partialMatch)
{
	// Start walking sibling lists, looking for matches.
	for (RefAST sibling=this;
			sibling;
			sibling=sibling->getNextSibling())
	{
		if ( (partialMatch && sibling->equalsTreePartial(target)) ||
				(!partialMatch && sibling->equalsTree(target)) ) {
			v.push_back(sibling);
		}
		// regardless of match or not, check any children for matches
		if ( sibling->getFirstChild() ) {
			RefBaseAST(sibling->getFirstChild())->doWorkForFindAll(v, target, partialMatch);
		}
	}
}